

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushStyleVar(ImGuiStyleVar idx,float val)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  ImGuiStyleVarInfo *pIVar3;
  ImGuiStyleMod local_24;
  
  pIVar3 = GetStyleVarInfo(idx);
  pIVar2 = GImGui;
  if ((pIVar3->Type == 8) && (pIVar3->Count == 1)) {
    uVar1 = pIVar3->Offset;
    local_24.field_1.BackupInt[0] = *(int *)((long)&(GImGui->Style).Alpha + (ulong)uVar1);
    local_24.VarIdx = idx;
    ImVector<ImGuiStyleMod>::push_back(&GImGui->StyleVarStack,&local_24);
    *(float *)((long)&(pIVar2->Style).Alpha + (ulong)uVar1) = val;
    return;
  }
  __assert_fail("0 && \"Called PushStyleVar() float variant but variable is not a float!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0x9ce,"void ImGui::PushStyleVar(ImGuiStyleVar, float)");
}

Assistant:

void ImGui::PushStyleVar(ImGuiStyleVar idx, float val)
{
    const ImGuiStyleVarInfo* var_info = GetStyleVarInfo(idx);
    if (var_info->Type == ImGuiDataType_Float && var_info->Count == 1)
    {
        ImGuiContext& g = *GImGui;
        float* pvar = (float*)var_info->GetVarPtr(&g.Style);
        g.StyleVarStack.push_back(ImGuiStyleMod(idx, *pvar));
        *pvar = val;
        return;
    }
    IM_ASSERT(0 && "Called PushStyleVar() float variant but variable is not a float!");
}